

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VTKData.h
# Opt level: O1

void __thiscall VTKCollection::append(VTKCollection *this,string *filename)

{
  ostream *poVar1;
  
  if (this->hasHeader_ == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this,
               "<?xml version=\"1.0\"?>\n<VTKFile type=\"Collection\" version=\"0.1\" byte_order=\"LittleEndian\">\n <Collection>\n"
               ,0x68);
    this->hasHeader_ = true;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this,"<DataSet group=\"\" part=\"0\" timestep=\"",0x25);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)this);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\" file=\"",8);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(filename->_M_dataplus)._M_p,filename->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\" />\n",5);
  this->recordID_ = this->recordID_ + 1;
  return;
}

Assistant:

void append(std::string filename)
  {
    if (!hasHeader_)
      writeHeader();
      
    outFile_ <<
      "<DataSet group=\"\" part=\"0\" timestep=\"" << recordID_ << "\" file=\"" << filename << "\" />\n";
    
    recordID_++;
  }